

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

size_t CBB_len(CBB *cbb)

{
  CBB *cbb_local;
  
  if (cbb->child != (CBB *)0x0) {
    __assert_fail("cbb->child == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0x11b,"size_t CBB_len(const CBB *)");
  }
  if (cbb->is_child == '\0') {
    cbb_local = (CBB *)(cbb->u).base.len;
  }
  else {
    if (((cbb->u).child.base)->len < (cbb->u).base.len + (ulong)(cbb->u).child.pending_len_len) {
      __assert_fail("cbb->u.child.offset + cbb->u.child.pending_len_len <= cbb->u.child.base->len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                    ,0x11e,"size_t CBB_len(const CBB *)");
    }
    cbb_local = (CBB *)((((cbb->u).child.base)->len - (cbb->u).base.len) -
                       (ulong)(cbb->u).child.pending_len_len);
  }
  return (size_t)cbb_local;
}

Assistant:

size_t CBB_len(const CBB *cbb) {
  assert(cbb->child == NULL);
  if (cbb->is_child) {
    assert(cbb->u.child.offset + cbb->u.child.pending_len_len <=
           cbb->u.child.base->len);
    return cbb->u.child.base->len - cbb->u.child.offset -
           cbb->u.child.pending_len_len;
  }
  return cbb->u.base.len;
}